

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.h
# Opt level: O2

char * __thiscall
btGeneric6DofSpring2Constraint::serialize
          (btGeneric6DofSpring2Constraint *this,void *dataBuffer,btSerializer *serializer)

{
  btRotationalLimitMotor2 *pbVar1;
  bool *pbVar2;
  long lVar3;
  undefined1 uVar4;
  
  btTypedConstraint::serialize(&this->super_btTypedConstraint,dataBuffer,serializer);
  btTransform::serialize(&this->m_frameInA,(btTransformFloatData *)((long)dataBuffer + 0x40));
  btTransform::serialize(&this->m_frameInB,(btTransformFloatData *)((long)dataBuffer + 0x80));
  pbVar1 = this->m_angularLimits;
  for (lVar3 = -0xc; lVar3 != 0; lVar3 = lVar3 + 4) {
    *(btScalar *)((long)dataBuffer + lVar3 + 0x1c4) = pbVar1->m_loLimit;
    *(btScalar *)((long)dataBuffer + lVar3 + 0x1b4) = pbVar1->m_hiLimit;
    *(btScalar *)((long)dataBuffer + lVar3 + 0x1d4) = pbVar1->m_bounce;
    *(btScalar *)((long)dataBuffer + lVar3 + 0x1e4) = pbVar1->m_stopERP;
    *(btScalar *)((long)dataBuffer + lVar3 + 500) = pbVar1->m_stopCFM;
    *(btScalar *)((long)dataBuffer + lVar3 + 0x204) = pbVar1->m_motorERP;
    *(btScalar *)((long)dataBuffer + lVar3 + 0x214) = pbVar1->m_motorCFM;
    *(btScalar *)((long)dataBuffer + lVar3 + 0x224) = pbVar1->m_targetVelocity;
    *(btScalar *)((long)dataBuffer + lVar3 + 0x234) = pbVar1->m_maxMotorForce;
    *(btScalar *)((long)dataBuffer + lVar3 + 0x244) = pbVar1->m_servoTarget;
    *(btScalar *)((long)dataBuffer + lVar3 + 0x254) = pbVar1->m_springStiffness;
    *(btScalar *)((long)dataBuffer + lVar3 + 0x264) = pbVar1->m_springDamping;
    *(btScalar *)((long)dataBuffer + lVar3 + 0x274) = pbVar1->m_equilibriumPoint;
    pbVar1 = pbVar1 + 1;
  }
  *(undefined4 *)((long)dataBuffer + 0x1c4) = 0;
  *(undefined4 *)((long)dataBuffer + 0x1b4) = 0;
  *(undefined4 *)((long)dataBuffer + 0x1d4) = 0;
  *(undefined4 *)((long)dataBuffer + 0x1e4) = 0;
  *(undefined4 *)((long)dataBuffer + 500) = 0;
  *(undefined4 *)((long)dataBuffer + 0x204) = 0;
  *(undefined4 *)((long)dataBuffer + 0x214) = 0;
  *(undefined4 *)((long)dataBuffer + 0x224) = 0;
  *(undefined4 *)((long)dataBuffer + 0x234) = 0;
  *(undefined4 *)((long)dataBuffer + 0x244) = 0;
  *(undefined4 *)((long)dataBuffer + 0x254) = 0;
  *(undefined4 *)((long)dataBuffer + 0x264) = 0;
  *(undefined4 *)((long)dataBuffer + 0x274) = 0;
  pbVar2 = &this->m_angularLimits[0].m_springDampingLimited;
  lVar3 = 0;
  do {
    if (lVar3 == 3) {
      uVar4 = 0;
      *(undefined1 *)((long)dataBuffer + 0x27b) = 0;
      *(undefined1 *)((long)dataBuffer + 0x27f) = 0;
      *(undefined1 *)((long)dataBuffer + 0x283) = 0;
      *(undefined1 *)((long)dataBuffer + 0x287) = 0;
    }
    else {
      if (lVar3 == 4) {
        btVector3::serialize
                  (&(this->m_linearLimits).m_lowerLimit,
                   (btVector3FloatData *)((long)dataBuffer + 0xd0));
        btVector3::serialize
                  (&(this->m_linearLimits).m_upperLimit,
                   (btVector3FloatData *)((long)dataBuffer + 0xc0));
        btVector3::serialize
                  (&(this->m_linearLimits).m_bounce,(btVector3FloatData *)((long)dataBuffer + 0xe0))
        ;
        btVector3::serialize
                  (&(this->m_linearLimits).m_stopERP,(btVector3FloatData *)((long)dataBuffer + 0xf0)
                  );
        btVector3::serialize
                  (&(this->m_linearLimits).m_stopCFM,
                   (btVector3FloatData *)((long)dataBuffer + 0x100));
        btVector3::serialize
                  (&(this->m_linearLimits).m_motorERP,
                   (btVector3FloatData *)((long)dataBuffer + 0x110));
        btVector3::serialize
                  (&(this->m_linearLimits).m_motorCFM,
                   (btVector3FloatData *)((long)dataBuffer + 0x120));
        btVector3::serialize
                  (&(this->m_linearLimits).m_targetVelocity,
                   (btVector3FloatData *)((long)dataBuffer + 0x130));
        btVector3::serialize
                  (&(this->m_linearLimits).m_maxMotorForce,
                   (btVector3FloatData *)((long)dataBuffer + 0x140));
        btVector3::serialize
                  (&(this->m_linearLimits).m_servoTarget,
                   (btVector3FloatData *)((long)dataBuffer + 0x150));
        btVector3::serialize
                  (&(this->m_linearLimits).m_springStiffness,
                   (btVector3FloatData *)((long)dataBuffer + 0x160));
        btVector3::serialize
                  (&(this->m_linearLimits).m_springDamping,
                   (btVector3FloatData *)((long)dataBuffer + 0x170));
        btVector3::serialize
                  (&(this->m_linearLimits).m_equilibriumPoint,
                   (btVector3FloatData *)((long)dataBuffer + 0x180));
        lVar3 = 0;
        do {
          if (lVar3 == 3) {
            uVar4 = 0;
            *(undefined1 *)((long)dataBuffer + 0x193) = 0;
            *(undefined1 *)((long)dataBuffer + 0x197) = 0;
            *(undefined1 *)((long)dataBuffer + 0x19b) = 0;
            *(undefined1 *)((long)dataBuffer + 0x19f) = 0;
          }
          else {
            if (lVar3 == 4) {
              *(RotateOrder *)((long)dataBuffer + 0x28c) = this->m_rotateOrder;
              return "btGeneric6DofSpring2ConstraintData";
            }
            *(bool *)((long)dataBuffer + lVar3 + 400) = (this->m_linearLimits).m_enableMotor[lVar3];
            *(bool *)((long)dataBuffer + lVar3 + 0x194) = (this->m_linearLimits).m_servoMotor[lVar3]
            ;
            *(bool *)((long)dataBuffer + lVar3 + 0x198) =
                 (this->m_linearLimits).m_enableSpring[lVar3];
            *(bool *)((long)dataBuffer + lVar3 + 0x19c) =
                 (this->m_linearLimits).m_springStiffnessLimited[lVar3];
            uVar4 = (this->m_linearLimits).m_springDampingLimited[lVar3];
          }
          *(undefined1 *)((long)dataBuffer + lVar3 + 0x1a0) = uVar4;
          lVar3 = lVar3 + 1;
        } while( true );
      }
      *(bool *)((long)dataBuffer + lVar3 + 0x278) = pbVar2[-0x24];
      *(bool *)((long)dataBuffer + lVar3 + 0x27c) = pbVar2[-0x18];
      *(bool *)((long)dataBuffer + lVar3 + 0x280) = pbVar2[-0x10];
      *(bool *)((long)dataBuffer + lVar3 + 0x284) = pbVar2[-8];
      uVar4 = *pbVar2;
    }
    *(undefined1 *)((long)dataBuffer + lVar3 + 0x288) = uVar4;
    lVar3 = lVar3 + 1;
    pbVar2 = pbVar2 + 0x58;
  } while( true );
}

Assistant:

SIMD_FORCE_INLINE const char* btGeneric6DofSpring2Constraint::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btGeneric6DofSpring2ConstraintData2* dof = (btGeneric6DofSpring2ConstraintData2*)dataBuffer;
	btTypedConstraint::serialize(&dof->m_typeConstraintData,serializer);

	m_frameInA.serialize(dof->m_rbAFrame);
	m_frameInB.serialize(dof->m_rbBFrame);

	int i;
	for (i=0;i<3;i++)
	{
		dof->m_angularLowerLimit.m_floats[i]       = m_angularLimits[i].m_loLimit;
		dof->m_angularUpperLimit.m_floats[i]       = m_angularLimits[i].m_hiLimit;
		dof->m_angularBounce.m_floats[i]           = m_angularLimits[i].m_bounce;
		dof->m_angularStopERP.m_floats[i]          = m_angularLimits[i].m_stopERP;
		dof->m_angularStopCFM.m_floats[i]          = m_angularLimits[i].m_stopCFM;
		dof->m_angularMotorERP.m_floats[i]         = m_angularLimits[i].m_motorERP;
		dof->m_angularMotorCFM.m_floats[i]         = m_angularLimits[i].m_motorCFM;
		dof->m_angularTargetVelocity.m_floats[i]   = m_angularLimits[i].m_targetVelocity;
		dof->m_angularMaxMotorForce.m_floats[i]    = m_angularLimits[i].m_maxMotorForce;
		dof->m_angularServoTarget.m_floats[i]      = m_angularLimits[i].m_servoTarget;
		dof->m_angularSpringStiffness.m_floats[i]  = m_angularLimits[i].m_springStiffness;
		dof->m_angularSpringDamping.m_floats[i]    = m_angularLimits[i].m_springDamping;
		dof->m_angularEquilibriumPoint.m_floats[i] = m_angularLimits[i].m_equilibriumPoint;
	}
	dof->m_angularLowerLimit.m_floats[3]       = 0;
	dof->m_angularUpperLimit.m_floats[3]       = 0;
	dof->m_angularBounce.m_floats[3]           = 0;
	dof->m_angularStopERP.m_floats[3]          = 0;
	dof->m_angularStopCFM.m_floats[3]          = 0;
	dof->m_angularMotorERP.m_floats[3]         = 0;
	dof->m_angularMotorCFM.m_floats[3]         = 0;
	dof->m_angularTargetVelocity.m_floats[3]   = 0;
	dof->m_angularMaxMotorForce.m_floats[3]    = 0;
	dof->m_angularServoTarget.m_floats[3]      = 0;
	dof->m_angularSpringStiffness.m_floats[3]  = 0;
	dof->m_angularSpringDamping.m_floats[3]    = 0;
	dof->m_angularEquilibriumPoint.m_floats[3] = 0;
	for (i=0;i<4;i++)
	{
		dof->m_angularEnableMotor[i]            = i < 3 ? ( m_angularLimits[i].m_enableMotor ? 1 : 0 ) : 0;
		dof->m_angularServoMotor[i]             = i < 3 ? ( m_angularLimits[i].m_servoMotor ? 1 : 0 ) : 0;
		dof->m_angularEnableSpring[i]           = i < 3 ? ( m_angularLimits[i].m_enableSpring ? 1 : 0 ) : 0;
		dof->m_angularSpringStiffnessLimited[i] = i < 3 ? ( m_angularLimits[i].m_springStiffnessLimited ? 1 : 0 ) : 0;
		dof->m_angularSpringDampingLimited[i]   = i < 3 ? ( m_angularLimits[i].m_springDampingLimited ? 1 : 0 ) : 0;
	}

	m_linearLimits.m_lowerLimit.serialize( dof->m_linearLowerLimit );
	m_linearLimits.m_upperLimit.serialize( dof->m_linearUpperLimit );
	m_linearLimits.m_bounce.serialize( dof->m_linearBounce );
	m_linearLimits.m_stopERP.serialize( dof->m_linearStopERP );
	m_linearLimits.m_stopCFM.serialize( dof->m_linearStopCFM );
	m_linearLimits.m_motorERP.serialize( dof->m_linearMotorERP );
	m_linearLimits.m_motorCFM.serialize( dof->m_linearMotorCFM );
	m_linearLimits.m_targetVelocity.serialize( dof->m_linearTargetVelocity );
	m_linearLimits.m_maxMotorForce.serialize( dof->m_linearMaxMotorForce );
	m_linearLimits.m_servoTarget.serialize( dof->m_linearServoTarget );
	m_linearLimits.m_springStiffness.serialize( dof->m_linearSpringStiffness );
	m_linearLimits.m_springDamping.serialize( dof->m_linearSpringDamping );
	m_linearLimits.m_equilibriumPoint.serialize( dof->m_linearEquilibriumPoint );
	for (i=0;i<4;i++)
	{
		dof->m_linearEnableMotor[i]            = i < 3 ? ( m_linearLimits.m_enableMotor[i] ? 1 : 0 ) : 0;
		dof->m_linearServoMotor[i]             = i < 3 ? ( m_linearLimits.m_servoMotor[i] ? 1 : 0 ) : 0;
		dof->m_linearEnableSpring[i]           = i < 3 ? ( m_linearLimits.m_enableSpring[i] ? 1 : 0 ) : 0;
		dof->m_linearSpringStiffnessLimited[i] = i < 3 ? ( m_linearLimits.m_springStiffnessLimited[i] ? 1 : 0 ) : 0;
		dof->m_linearSpringDampingLimited[i]   = i < 3 ? ( m_linearLimits.m_springDampingLimited[i] ? 1 : 0 ) : 0;
	}

	dof->m_rotateOrder = m_rotateOrder;

	return btGeneric6DofSpring2ConstraintDataName;
}